

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O0

int WebRtc_set_lookahead(void *handle,int lookahead)

{
  DelayEstimator *self;
  int lookahead_local;
  void *handle_local;
  
  if (handle == (void *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/utility/delay_estimator_wrapper.cc"
                  ,0x164,"int WebRtc_set_lookahead(void *, int)");
  }
  if (*(long *)((long)handle + 0x10) != 0) {
    if ((*(int *)(*(long *)((long)handle + 0x10) + 0x18) + -1 < lookahead) || (lookahead < 0)) {
      handle_local._4_4_ = -1;
    }
    else {
      *(int *)(*(long *)((long)handle + 0x10) + 0x4c) = lookahead;
      handle_local._4_4_ = *(int *)(*(long *)((long)handle + 0x10) + 0x4c);
    }
    return handle_local._4_4_;
  }
  __assert_fail("self->binary_handle != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/utility/delay_estimator_wrapper.cc"
                ,0x165,"int WebRtc_set_lookahead(void *, int)");
}

Assistant:

int WebRtc_set_lookahead(void* handle, int lookahead) {
  DelayEstimator* self = (DelayEstimator*) handle;
  assert(self != NULL);
  assert(self->binary_handle != NULL);
  if ((lookahead > self->binary_handle->near_history_size - 1) ||
      (lookahead < 0)) {
    return -1;
  }
  self->binary_handle->lookahead = lookahead;
  return self->binary_handle->lookahead;
}